

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O0

void __thiscall SceneRender::printDefines(SceneRender *this)

{
  ostream *poVar1;
  Shader *pSVar2;
  size_type sVar3;
  void *pvVar4;
  reference ppMVar5;
  ulong local_20;
  size_t i_1;
  size_t i;
  SceneRender *this_local;
  
  if ((this->m_background & 1U) != 0) {
    poVar1 = std::operator<<((ostream *)&std::cout,".");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"| BACKGROUND");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    vera::HaveDefines::printDefines(&(this->m_background_shader).super_HaveDefines);
  }
  if (-1 < this->m_floor_subd) {
    poVar1 = std::operator<<((ostream *)&std::cout,".");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"| FLOOR");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    pSVar2 = vera::Model::getShader(&this->m_floor);
    (*(pSVar2->super_HaveDefines)._vptr_HaveDefines[0x10])();
  }
  i_1 = 0;
  while( true ) {
    sVar3 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                      (&this->m_devlook_spheres);
    if (sVar3 <= i_1) break;
    poVar1 = std::operator<<((ostream *)&std::cout,".");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"| DEVLOOK SPHERE ");
    pvVar4 = (void *)std::ostream::operator<<(poVar1,i_1);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    ppMVar5 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                        (&this->m_devlook_spheres,i_1);
    pSVar2 = vera::Model::getShader(*ppMVar5);
    (*(pSVar2->super_HaveDefines)._vptr_HaveDefines[0x10])();
    i_1 = i_1 + 1;
  }
  local_20 = 0;
  while( true ) {
    sVar3 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::size
                      (&this->m_devlook_billboards);
    if (sVar3 <= local_20) break;
    poVar1 = std::operator<<((ostream *)&std::cout,".");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"| DEVLOOK BILLBOARD ");
    pvVar4 = (void *)std::ostream::operator<<(poVar1,local_20);
    std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,"+------------- ");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    ppMVar5 = std::vector<vera::Model_*,_std::allocator<vera::Model_*>_>::operator[]
                        (&this->m_devlook_billboards,local_20);
    pSVar2 = vera::Model::getShader(*ppMVar5);
    (*(pSVar2->super_HaveDefines)._vptr_HaveDefines[0x10])();
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void SceneRender::printDefines() {
    if (m_background) {
        std::cout << "." << std::endl;
        std::cout << "| BACKGROUND" << std::endl;
        std::cout << "+------------- " << std::endl;
        m_background_shader.printDefines();
    }

    if (m_floor_subd >= 0) {
        std::cout << "." << std::endl;
        std::cout << "| FLOOR" << std::endl;
        std::cout << "+------------- " << std::endl;
        m_floor.getShader()->printDefines();
    }

    for (size_t i = 0; i < m_devlook_spheres.size(); i++) {
        std::cout << "." << std::endl;
        std::cout << "| DEVLOOK SPHERE " << i << std::endl;
        std::cout << "+------------- " << std::endl;
        m_devlook_spheres[i]->getShader()->printDefines();
    }

    for (size_t i = 0; i < m_devlook_billboards.size(); i++) {
        std::cout << "." << std::endl;
        std::cout << "| DEVLOOK BILLBOARD " << i << std::endl;
        std::cout << "+------------- " << std::endl;
        m_devlook_billboards[i]->getShader()->printDefines();
    }
}